

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

double duckdb::Cast::Operation<duckdb::dtime_tz_t,double>(dtime_tz_t input)

{
  bool bVar1;
  string *msg;
  double *in_RDI;
  dtime_tz_t unaff_retaddr;
  double result;
  dtime_tz_t in_stack_000001a8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 local_10;
  undefined1 in_stack_fffffffffffffff7;
  
  bVar1 = TryCast::Operation<duckdb::dtime_tz_t,double>
                    (unaff_retaddr,in_RDI,(bool)in_stack_fffffffffffffff7);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::dtime_tz_t,double>(in_stack_000001a8);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return (double)CONCAT17(in_stack_fffffffffffffff7,local_10);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}